

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DExporter::Export_Mesh(X3DExporter *this,size_t pIdxMesh,size_t pTabLevel)

{
  _Rb_tree_header *p_Var1;
  aiCamera *paVar2;
  aiCamera **ppaVar3;
  size_t pTabLevel_00;
  uint __val;
  pointer pcVar4;
  bool bVar5;
  X3DExporter *this_00;
  size_t pTabLevel_01;
  char cVar6;
  mapped_type *pmVar7;
  _Node *p_Var8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  long *plVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  char *__s;
  aiMesh *paVar15;
  char cVar16;
  aiCamera *paVar17;
  undefined8 uVar18;
  aiNode *paVar19;
  aiCamera **ppaVar20;
  aiFace *paVar21;
  ulong uVar22;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  string attr_value;
  string coordIndex;
  string mesh_name;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  size_t local_c8;
  string local_c0;
  aiMesh *local_a0;
  char *local_98;
  aiTexture **local_90;
  char local_88;
  char acStack_87 [15];
  _Base_ptr local_78;
  aiCamera **local_70;
  _Alloc_hider local_68;
  aiCamera *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  X3DExporter *local_48;
  size_t local_40;
  ulong local_38;
  
  local_d8._0_8_ = local_d8;
  local_c8 = 0;
  p_Var1 = &(this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = (this->mDEF_Map_Mesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var13 = &p_Var1->_M_header;
  for (; p_Var14 != (_Base_ptr)0x0;
      p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < pIdxMesh]) {
    if (*(ulong *)(p_Var14 + 1) >= pIdxMesh) {
      p_Var13 = p_Var14;
    }
  }
  p_Var14 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
     (p_Var14 = p_Var13, pIdxMesh < *(ulong *)(p_Var13 + 1))) {
    p_Var14 = &p_Var1->_M_header;
  }
  local_d8._8_8_ = local_d8._0_8_;
  local_78 = (_Base_ptr)pIdxMesh;
  if ((_Rb_tree_header *)p_Var14 == p_Var1) {
    paVar15 = this->mScene->mMeshes[pIdxMesh];
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_IDX_","");
    __s = (paVar15->mName).data;
    local_a0 = paVar15;
    strlen(__s);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)__s);
    p_Var14 = local_78;
    pcVar4 = local_118 + 0x10;
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_108._M_allocated_capacity = *plVar12;
      local_108._8_8_ = plVar9[3];
      local_118._0_8_ = pcVar4;
    }
    else {
      local_108._M_allocated_capacity = *plVar12;
      local_118._0_8_ = (long *)*plVar9;
    }
    local_118._8_8_ = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cVar16 = '\x01';
    if ((_Base_ptr)0x9 < local_78) {
      p_Var13 = local_78;
      cVar6 = '\x04';
      do {
        cVar16 = cVar6;
        if (p_Var13 < (_Base_ptr)0x64) {
          cVar16 = cVar16 + -2;
          goto LAB_0036757b;
        }
        if (p_Var13 < (_Base_ptr)0x3e8) {
          cVar16 = cVar16 + -1;
          goto LAB_0036757b;
        }
        if (p_Var13 < (_Base_ptr)0x2710) goto LAB_0036757b;
        bVar5 = (_Base_ptr)0x1869f < p_Var13;
        p_Var13 = (_Base_ptr)((ulong)p_Var13 / 10000);
        cVar6 = cVar16 + '\x04';
      } while (bVar5);
      cVar16 = cVar16 + '\x01';
    }
LAB_0036757b:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,(unsigned_long)p_Var14);
    paVar2 = (aiCamera *)((long)(_Rb_tree_color *)local_c0._M_string_length + local_118._8_8_);
    uVar18 = (aiCamera *)0xf;
    if ((pointer)local_118._0_8_ != pcVar4) {
      uVar18 = local_108._M_allocated_capacity;
    }
    if ((ulong)uVar18 < paVar2) {
      paVar17 = (aiCamera *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        paVar17 = (aiCamera *)
                  CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                           local_c0.field_2._M_local_buf[0]);
      }
      if (paVar17 < paVar2) goto LAB_003675e4;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,local_118._0_8_);
    }
    else {
LAB_003675e4:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append(local_118,(ulong)local_c0._M_dataplus._M_p);
    }
    local_70 = &local_60;
    ppaVar20 = (aiCamera **)(puVar10 + 2);
    if ((aiCamera **)*puVar10 == ppaVar20) {
      local_60 = *ppaVar20;
      aStack_58._M_allocated_capacity = puVar10[3];
    }
    else {
      local_60 = *ppaVar20;
      local_70 = (aiCamera **)*puVar10;
    }
    local_68._M_p = (pointer)puVar10[1];
    *puVar10 = ppaVar20;
    puVar10[1] = 0;
    *(undefined1 *)ppaVar20 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((pointer)local_118._0_8_ != pcVar4) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(acStack_87._0_7_,local_88) + 1);
    }
    local_118._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"DEF","");
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_70,local_68._M_p + (long)local_70);
    p_Var8 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8,(SAttribute *)local_118);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    local_c8 = local_c8 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((pointer)local_118._0_8_ != pcVar4) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    pmVar7 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->mDEF_Map_Mesh,(key_type_conflict1 *)&local_78);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    local_118._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Shape","");
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8);
    if ((pointer)local_118._0_8_ != pcVar4) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_d8);
    local_c8 = 0;
    aStack_58._8_8_ = pTabLevel + 1;
    local_d8._0_8_ = (aiNode *)local_d8;
    local_d8._8_8_ = (aiNode *)local_d8;
    Export_Material(this,(ulong)local_a0->mMaterialIndex,aStack_58._8_8_);
    paVar15 = local_a0;
    local_90 = (aiTexture **)0x0;
    local_88 = '\0';
    local_98 = &local_88;
    local_48 = this;
    local_40 = pTabLevel;
    std::__cxx11::string::reserve((ulong)&local_98);
    if (paVar15->mNumFaces != 0) {
      uVar22 = 0;
      do {
        local_38 = uVar22;
        if (paVar15->mFaces[uVar22].mNumIndices != 0) {
          paVar21 = paVar15->mFaces + uVar22;
          uVar22 = 0;
          do {
            __val = paVar21->mIndices[uVar22];
            cVar16 = '\x01';
            if (9 < __val) {
              uVar11 = __val;
              cVar6 = '\x04';
              do {
                cVar16 = cVar6;
                if (uVar11 < 100) {
                  cVar16 = cVar16 + -2;
                  goto LAB_003678a5;
                }
                if (uVar11 < 1000) {
                  cVar16 = cVar16 + -1;
                  goto LAB_003678a5;
                }
                if (uVar11 < 10000) goto LAB_003678a5;
                bVar5 = 99999 < uVar11;
                uVar11 = uVar11 / 10000;
                cVar6 = cVar16 + '\x04';
              } while (bVar5);
              cVar16 = cVar16 + '\x01';
            }
LAB_003678a5:
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_c0,cVar16);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,__val);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_118._0_8_ = local_118 + 0x10;
            plVar12 = plVar9 + 2;
            if ((long *)*plVar9 == plVar12) {
              local_108._M_allocated_capacity = *plVar12;
              local_108._8_8_ = plVar9[3];
            }
            else {
              local_108._M_allocated_capacity = *plVar12;
              local_118._0_8_ = (long *)*plVar9;
            }
            local_118._8_8_ = plVar9[1];
            *plVar9 = (long)plVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_98,local_118._0_8_);
            if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,
                              CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                       local_c0.field_2._M_local_buf[0]) + 1);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < paVar21->mNumIndices);
        }
        std::__cxx11::string::append((char *)&local_98);
        uVar22 = local_38 + 1;
        paVar15 = local_a0;
      } while (uVar22 < local_a0->mNumFaces);
    }
    std::__cxx11::string::resize((ulong)&local_98,(char)local_90 + -1);
    ppaVar20 = (aiCamera **)(local_118 + 0x10);
    local_118._0_8_ = ppaVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"coordIndex","");
    pTabLevel_01 = local_40;
    this_00 = local_48;
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_98,(char *)((long)local_90 + (long)local_98));
    p_Var8 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8,(SAttribute *)local_118);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    local_c8 = local_c8 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    local_118._0_8_ = ppaVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"IndexedFaceSet","");
    NodeHelper_OpenNode(this_00,(string *)local_118,aStack_58._8_8_,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8);
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    paVar19 = (aiNode *)local_d8;
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_d8);
    local_c8 = 0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_d8._0_8_ = (aiNode *)local_d8;
    local_d8._8_8_ = (aiNode *)local_d8;
    AttrHelper_Vec3DArrToString
              ((X3DExporter *)paVar19,local_a0->mVertices,(ulong)local_a0->mNumVertices,&local_c0);
    local_118._0_8_ = ppaVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"point","");
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + (long)(_Rb_tree_color *)local_c0._M_string_length);
    p_Var8 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8,(SAttribute *)local_118);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    local_c8 = local_c8 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    local_118._0_8_ = ppaVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Coordinate","");
    pTabLevel_00 = pTabLevel_01 + 2;
    NodeHelper_OpenNode(this_00,(string *)local_118,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8);
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    paVar19 = (aiNode *)local_d8;
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)local_d8);
    local_c8 = 0;
    if (local_a0->mNumVertices != 0 && local_a0->mColors[0] != (aiColor4D *)0x0) {
      local_d8._0_8_ = (aiNode *)local_d8;
      local_d8._8_8_ = (aiNode *)local_d8;
      AttrHelper_Col4DArrToString
                ((X3DExporter *)paVar19,local_a0->mColors[0],(ulong)local_a0->mNumVertices,&local_c0
                );
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"color","");
      local_f8._M_p = (pointer)&local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + (long)(_Rb_tree_color *)local_c0._M_string_length);
      p_Var8 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)local_d8,(SAttribute *)local_118);
      std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
      local_c8 = local_c8 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
      }
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ColorRGBA","");
      paVar19 = (aiNode *)local_d8;
      NodeHelper_OpenNode(this_00,(string *)local_118,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)paVar19);
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)paVar19);
    }
    local_d8._0_8_ = local_d8;
    local_c8 = 0;
    if (local_a0->mNumVertices != 0 && local_a0->mTextureCoords[0] != (aiVector3D *)0x0) {
      local_d8._8_8_ = local_d8._0_8_;
      AttrHelper_Vec3DAsVec2fArrToString
                ((X3DExporter *)paVar19,local_a0->mTextureCoords[0],(ulong)local_a0->mNumVertices,
                 &local_c0);
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"point","");
      local_f8._M_p = (pointer)&local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + (long)(_Rb_tree_color *)local_c0._M_string_length);
      p_Var8 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)local_d8,(SAttribute *)local_118);
      std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
      local_c8 = local_c8 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
      }
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"TextureCoordinate","");
      paVar19 = (aiNode *)local_d8;
      NodeHelper_OpenNode(this_00,(string *)local_118,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)paVar19);
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)paVar19);
    }
    local_d8._0_8_ = local_d8;
    local_c8 = 0;
    if (local_a0->mNumVertices != 0 && local_a0->mNormals != (aiVector3D *)0x0) {
      local_d8._8_8_ = local_d8._0_8_;
      AttrHelper_Vec3DArrToString
                ((X3DExporter *)paVar19,local_a0->mNormals,(ulong)local_a0->mNumVertices,&local_c0);
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"vector","");
      local_f8._M_p = (pointer)&local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_c0._M_dataplus._M_p,
                 local_c0._M_dataplus._M_p + (long)(_Rb_tree_color *)local_c0._M_string_length);
      p_Var8 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)local_d8,(SAttribute *)local_118);
      std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
      local_c8 = local_c8 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
      }
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      local_118._0_8_ = ppaVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Normal","");
      NodeHelper_OpenNode(this_00,(string *)local_118,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)local_d8);
      if ((aiCamera **)local_118._0_8_ != ppaVar20) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)local_d8);
    }
    local_d8._0_8_ = local_d8;
    local_c8 = 0;
    local_118._0_8_ = ppaVar20;
    local_d8._8_8_ = local_d8._0_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"IndexedFaceSet","");
    NodeHelper_CloseNode(this_00,(string *)local_118,aStack_58._8_8_);
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    local_118._0_8_ = ppaVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Shape","");
    NodeHelper_CloseNode(this_00,(string *)local_118,pTabLevel_01);
    if ((aiCamera **)local_118._0_8_ != ppaVar20) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(acStack_87._0_7_,local_88) + 1);
    }
    uVar18 = local_60;
    ppaVar20 = local_70;
    if (local_70 == &local_60) goto LAB_00368017;
  }
  else {
    ppaVar3 = (aiCamera **)(local_118 + 0x10);
    local_118._0_8_ = ppaVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"USE","");
    pmVar7 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mDEF_Map_Mesh,(key_type_conflict1 *)&local_78);
    pcVar4 = (pmVar7->_M_dataplus)._M_p;
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar4,pcVar4 + pmVar7->_M_string_length);
    p_Var8 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8,(SAttribute *)local_118);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    local_c8 = local_c8 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((aiCamera **)local_118._0_8_ != ppaVar3) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._M_allocated_capacity + 1));
    }
    local_118._0_8_ = ppaVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Shape","");
    NodeHelper_OpenNode(this,(string *)local_118,pTabLevel,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)local_d8);
    uVar18 = local_108._M_allocated_capacity;
    ppaVar20 = (aiCamera **)local_118._0_8_;
    if ((aiCamera **)local_118._0_8_ == ppaVar3) goto LAB_00368017;
  }
  operator_delete(ppaVar20,(ulong)((long)&(((aiCamera *)uVar18)->mName).length + 1));
LAB_00368017:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
            *)local_d8);
  return;
}

Assistant:

void X3DExporter::Export_Mesh(const size_t pIdxMesh, const size_t pTabLevel)
{
const char* NodeName_IFS = "IndexedFaceSet";
const char* NodeName_Shape = "Shape";

list<SAttribute> attr_list;
aiMesh& mesh = *mScene->mMeshes[pIdxMesh];// create alias for conveniance.

	// Check if mesh already defined early.
	if(mDEF_Map_Mesh.find(pIdxMesh) != mDEF_Map_Mesh.end())
	{
		// Mesh already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Mesh.at(pIdxMesh)});
		NodeHelper_OpenNode(NodeName_Shape, pTabLevel, true, attr_list);

		return;
	}

	string mesh_name(mesh.mName.C_Str() + string("_IDX_") + to_string(pIdxMesh));// Create mesh name

	// Define mesh name.
	attr_list.push_back({"DEF", mesh_name});
	mDEF_Map_Mesh[pIdxMesh] = mesh_name;

	//
	// "Shape" node.
	//
	NodeHelper_OpenNode(NodeName_Shape, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Appearance" node.
	//
	Export_Material(mesh.mMaterialIndex, pTabLevel + 1);

	//
	// "IndexedFaceSet" node.
	//
	// Fill attributes which differ from default. In Assimp for colors, vertices and normals used one indices set. So, only "coordIndex" must be set.
	string coordIndex;

	// fill coordinates index.
	coordIndex.reserve(mesh.mNumVertices * 4);// Index + space + Face delimiter
	for(size_t idx_face = 0; idx_face < mesh.mNumFaces; idx_face++)
	{
		const aiFace& face_cur = mesh.mFaces[idx_face];

		for(size_t idx_vert = 0; idx_vert < face_cur.mNumIndices; idx_vert++)
		{
			coordIndex.append(to_string(face_cur.mIndices[idx_vert]) + " ");
		}

		coordIndex.append("-1 ");// face delimiter.
	}

	// remove last space symbol.
	coordIndex.resize(coordIndex.length() - 1);
	attr_list.push_back({"coordIndex", coordIndex});
	// create node
	NodeHelper_OpenNode(NodeName_IFS, pTabLevel + 1, false, attr_list);
	attr_list.clear();
	// Child nodes for "IndexedFaceSet" needed when used colors, textures or normals.
	string attr_value;

	// Export <Coordinate>
	AttrHelper_Vec3DArrToString(mesh.mVertices, mesh.mNumVertices, attr_value);
	attr_list.push_back({"point", attr_value});
	NodeHelper_OpenNode("Coordinate", pTabLevel + 2, true, attr_list);
	attr_list.clear();

	// Export <ColorRGBA>
	if(mesh.HasVertexColors(0))
	{
		AttrHelper_Col4DArrToString(mesh.mColors[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"color", attr_value});
		NodeHelper_OpenNode("ColorRGBA", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <TextureCoordinate>
	if(mesh.HasTextureCoords(0))
	{
		AttrHelper_Vec3DAsVec2fArrToString(mesh.mTextureCoords[0], mesh.mNumVertices, attr_value);
		attr_list.push_back({"point", attr_value});
		NodeHelper_OpenNode("TextureCoordinate", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	// Export <Normal>
	if(mesh.HasNormals())
	{
		AttrHelper_Vec3DArrToString(mesh.mNormals, mesh.mNumVertices, attr_value);
		attr_list.push_back({"vector", attr_value});
		NodeHelper_OpenNode("Normal", pTabLevel + 2, true, attr_list);
		attr_list.clear();
	}

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_IFS, pTabLevel + 1);
	NodeHelper_CloseNode(NodeName_Shape, pTabLevel);
}